

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT8 __thiscall VGMPlayer::GetSongInfo(VGMPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  UINT8 chipType;
  double dVar2;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    songInf->format = 0x56474d00;
    UVar1 = (this->_fileHdr).fileVer;
    songInf->fileVerMaj = (UINT16)(UVar1 >> 8);
    songInf->fileVerMin = (ushort)UVar1 & 0xff;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = 0xac44;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if ((this->_fileHdr).loopOfs == 0) {
      UVar1 = 0xffffffff;
    }
    else {
      UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])(this);
    }
    songInf->loopTick = UVar1;
    dVar2 = exp2((double)(int)(this->_fileHdr).volumeGain * 0.00390625);
    songInf->volGain = (int)(dVar2 * 65536.0 + 0.5);
    songInf->deviceCnt = 0;
    for (chipType = '\0'; chipType != '*'; chipType = chipType + '\x01') {
      UVar1 = GetChipCount(this,chipType);
      songInf->deviceCnt = songInf->deviceCnt + UVar1;
    }
    return '\0';
  }
  return 0xff;
}

Assistant:

UINT8 VGMPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	UINT8 vgmChip;
	
	songInf.format = FCC_VGM;
	songInf.fileVerMaj = (_fileHdr.fileVer >> 8) & 0xFFFFFF;
	songInf.fileVerMin = (_fileHdr.fileVer >> 0) & 0xFF;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = 44100;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _fileHdr.loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = (INT32)(0x10000 * pow(2.0, _fileHdr.volumeGain / (double)0x100) + 0.5);
	songInf.deviceCnt = 0;
	for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		songInf.deviceCnt += GetChipCount(vgmChip);
	
	return 0x00;
}